

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O3

int isobusfs_recv_err(int sock,isobusfs_err_msg *emsg)

{
  __u32 __errnum;
  isobusfs_stats *piVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  cmsghdr *__cmsg;
  ulong uVar6;
  uint __errnum_00;
  int iVar7;
  sock_extended_err *serr;
  sock_extended_err *psVar8;
  char control [200];
  msghdr local_130;
  cmsghdr local_f8 [12];
  
  local_130.msg_name = (void *)0x0;
  local_130.msg_namelen = 0;
  local_130.msg_iov = (iovec *)0x0;
  local_130.msg_iovlen = 0;
  local_130.msg_control = local_f8;
  local_130.msg_controllen = 200;
  local_130.msg_flags = 0;
  sVar3 = recvmsg(sock,&local_130,0x2040);
  if ((int)sVar3 == -1) {
    piVar4 = __errno_location();
    __errnum_00 = -*piVar4;
    pcVar5 = strerror(__errnum_00);
    isobusfs_log(LOG_LEVEL_ERROR,"recvmsg error notification: %i (%s)",(ulong)__errnum_00,pcVar5);
  }
  else if ((local_130.msg_flags & 8U) == 0) {
    emsg->serr = (sock_extended_err *)0x0;
    emsg->tss = (scm_timestamping *)0x0;
    __errnum_00 = 0;
    if ((cmsghdr *)local_130.msg_control != (cmsghdr *)0x0 && 0xf < local_130.msg_controllen) {
      __errnum_00 = 0;
      __cmsg = (cmsghdr *)local_130.msg_control;
      while (__cmsg->cmsg_len != 0) {
        iVar7 = __cmsg->cmsg_type;
        if (__cmsg->cmsg_level == 0x6b) {
          if (iVar7 != 4) goto LAB_001017e6;
          psVar8 = (sock_extended_err *)(__cmsg + 1);
          emsg->serr = psVar8;
LAB_001017fc:
          if (emsg->tss != (scm_timestamping *)0x0) {
            if (psVar8->ee_origin == '\x01') {
              if (psVar8->ee_info != 1) {
                warnx("serr: unknown ee_info: %i");
              }
              __errnum = psVar8->ee_errno;
              pcVar5 = strerror(__errnum);
              warnx("serr: tx error: %i, %s",__errnum,pcVar5);
              return psVar8->ee_errno;
            }
            if (psVar8->ee_origin == '\x04') {
              piVar1 = emsg->stats;
              if (psVar8->ee_errno != 0x2a) {
                warnx("serr: expected ENOMSG, got: %i");
              }
              (&piVar1->tskey_sch)[psVar8->ee_info != 1] = psVar8->ee_data;
              return (uint)(psVar8->ee_info != 1) * 4 + -4;
            }
            warnx("serr: wrong origin: %u");
            return 0;
          }
        }
        else {
          if (__cmsg->cmsg_level == 1) {
            if (iVar7 == 0x36) {
              iVar7 = (int)__cmsg->cmsg_len + -0x10;
              if (0 < iVar7) {
                piVar1 = emsg->stats;
                uVar6 = 0;
                do {
                  if (*(short *)((long)&__cmsg[1].cmsg_len + uVar6 + 2) == 1) {
                    piVar1->send = *(uint32_t *)((long)&__cmsg[1].cmsg_len + uVar6 + 4);
                  }
                  else {
                    warnx("not supported J1939_NLA field\n");
                  }
                  uVar2 = (*(ushort *)((long)&__cmsg[1].cmsg_len + uVar6) + 3 & 0xfffffffc) +
                          (int)uVar6;
                  uVar6 = (ulong)uVar2;
                } while ((int)uVar2 < iVar7);
              }
            }
            else {
              if (iVar7 != 0x25) goto LAB_001017e6;
              emsg->tss = (scm_timestamping *)(__cmsg + 1);
            }
          }
          else {
LAB_001017e6:
            warnx("serr: not supported type: %d.%d");
          }
          psVar8 = emsg->serr;
          if (psVar8 != (sock_extended_err *)0x0) goto LAB_001017fc;
        }
        __cmsg = __cmsg_nxthdr(&local_130,__cmsg);
        if (__cmsg == (cmsghdr *)0x0) {
          return 0;
        }
      }
    }
  }
  else {
    isobusfs_log(LOG_LEVEL_ERROR,"recvmsg error notification: truncated");
    __errnum_00 = 0xffffffea;
  }
  return __errnum_00;
}

Assistant:

int isobusfs_recv_err(int sock, struct isobusfs_err_msg *emsg)
{
	char control[200];
	struct cmsghdr *cm;
	int ret;
	struct msghdr msg = {
		.msg_control = control,
		.msg_controllen = sizeof(control),
	};

	ret = recvmsg(sock, &msg, MSG_ERRQUEUE | MSG_DONTWAIT);
	if (ret == -1) {
		ret = -errno;
		pr_err("recvmsg error notification: %i (%s)", ret, strerror(ret));
		return ret;
	}

	if (msg.msg_flags & MSG_CTRUNC) {
		pr_err("recvmsg error notification: truncated");
		return -EINVAL;
	}

	emsg->serr = NULL;
	emsg->tss = NULL;

	for (cm = CMSG_FIRSTHDR(&msg); cm && cm->cmsg_len;
	     cm = CMSG_NXTHDR(&msg, cm)) {
		isobusfs_parse_cm(emsg, cm);
		if (emsg->serr && emsg->tss)
			return isobusfs_extract_serr(emsg);
	}

	return 0;
}